

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_log.cpp
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
Kumu::operator<<(basic_ostream<char,_std::char_traits<char>_> *strm,LogEntry *Entry)

{
  string buf;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> s;
  string local_1d0;
  long *local_1b0;
  long local_1a8;
  long local_1a0 [2];
  long local_190 [2];
  undefined8 auStack_180 [12];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::ios::copyfmt((ios *)((ostringstream *)local_190 + *(long *)(local_190[0] + -0x18)));
  *(undefined8 *)((long)auStack_180 + *(long *)(local_190[0] + -0x18)) = 0;
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  LogEntry::CreateStringWithOptions(Entry,&local_1d0,-0x100000);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strm,(char *)local_1b0,local_1a8);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,
                    CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                             local_1d0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return strm;
}

Assistant:

std::basic_ostream<char, std::char_traits<char> >&
Kumu::operator<<(std::basic_ostream<char, std::char_traits<char> >& strm, LogEntry const& Entry)
{
  std::basic_ostringstream<char, std::char_traits<char> > s;
  s.copyfmt(strm);
  s.width(0);
  std::string buf;

  s << Entry.CreateStringWithOptions(buf, LOG_OPTION_ALL);

  strm << s.str();
  return strm;
}